

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

CtorDtorName * __thiscall
(anonymous_namespace)::Db::
make<(anonymous_namespace)::CtorDtorName,(anonymous_namespace)::Node*&,bool>
          (Db *this,Node **args,bool *args_1)

{
  CtorDtorName *this_00;
  bool *args_local_1;
  Node **args_local;
  Db *this_local;
  
  this_00 = (CtorDtorName *)
            anon_unknown.dwarf_153ab3::BumpPointerAllocator::allocate
                      ((BumpPointerAllocator *)(this + 0x2f0),0x20);
  anon_unknown.dwarf_153ab3::CtorDtorName::CtorDtorName(this_00,*args,(bool)(*args_1 & 1));
  return this_00;
}

Assistant:

T *make(Args &&... args) {
    return new (ASTAllocator.allocate(sizeof(T)))
        T(std::forward<Args>(args)...);
  }